

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O1

vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
vkt::tessellation::generateReferenceIsolineTessCoords
          (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           *__return_storage_ptr__,int outer0,int outer1)

{
  int iVar1;
  int iVar2;
  Vector<float,_3> local_3c;
  
  (__return_storage_ptr__->
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < outer0) {
    iVar1 = 0;
    do {
      if ((uint)outer1 < 0x7fffffff) {
        iVar2 = 0;
        do {
          local_3c.m_data[0] = (float)iVar2 / (float)outer1;
          local_3c.m_data[2] = 0.0;
          local_3c.m_data[1] = (float)iVar1 / (float)outer0;
          std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
          emplace_back<tcu::Vector<float,3>>
                    ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)
                     __return_storage_ptr__,&local_3c);
          iVar2 = iVar2 + 1;
        } while (outer1 + 1 != iVar2);
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 != outer0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::Vec3> generateReferenceIsolineTessCoords (const int outer0, const int outer1)
{
	std::vector<tcu::Vec3> tessCoords;

	for (int y = 0; y < outer0;   y++)
	for (int x = 0; x < outer1+1; x++)
		tessCoords.push_back(tcu::Vec3((float)x / (float)outer1,
									   (float)y / (float)outer0,
									   0.0f));

	return tessCoords;
}